

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAA.cpp
# Opt level: O2

bool __thiscall
GMAA_kGMAA::ConstructAndValuateNextPolicies
          (GMAA_kGMAA *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  pointer pdVar1;
  size_t *psVar2;
  string *__lhs;
  GeneralizedMAAStarPlanner *this_00;
  size_t sVar3;
  QFunctionJAOHInterface *q;
  BGIP_SolverCreatorInterface *pBVar4;
  DecPOMDPDiscreteInterface *pDVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  Index IVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  reference pvVar11;
  BayesianGameForDecPOMDPStage *this_01;
  ostream *poVar12;
  BayesianGameIdenticalPayoffSolver *p;
  uint uVar13;
  double __x;
  _Base_ptr p_Var14;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  undefined1 extraout_var_01 [56];
  shared_ptr<BayesianGameForDecPOMDPStage> bg_ts;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
  shared_ptr<JPPVValuePair> jpvp;
  PJPDP_sharedPtr jpolPrevTs;
  PJPDP_sharedPtr jpolTs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  poolOfNextPoliciesIndices;
  JointPolicyPureVector jpolBG;
  stringstream ss;
  shared_ptr<BayesianGameForDecPOMDPStage> local_388;
  size_t local_378;
  double local_370;
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_368;
  undefined1 local_358 [32];
  element_type *local_338;
  shared_count sStack_330;
  _List_node_base *local_328;
  shared_count asStack_320 [2];
  element_type *local_310;
  _List_node_base *local_308;
  shared_count sStack_300;
  TimedAlgorithm *local_2f8;
  priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  *local_2f0;
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *local_2e8;
  PartialPolicyPoolInterface_sharedPtr *local_2e0;
  _Base_ptr local_2d8;
  _Base_ptr local_2d0;
  _Base_ptr local_2c8;
  shared_count local_2c0;
  I_PtPDpure_constPtr local_2b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  undefined1 local_290 [8];
  shared_count local_288;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_280;
  JointPolicyPureVector local_250;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_1b8;
  ostream local_1a8 [376];
  undefined1 auVar16 [64];
  
  *cleanUpPPI = true;
  local_2e0 = poolOfNextPolicies;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_338);
  local_378 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
              _m_horizon;
  sVar3 = (local_338->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  iVar9 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
            _vptr_PlanningUnit[6])(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,
             CONCAT44(extraout_var,iVar9),(allocator_type *)&local_1b8);
  local_378 = local_378 - 1;
  uVar13 = 0;
  while( true ) {
    iVar9 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
              _vptr_PlanningUnit[6])(this);
    if (CONCAT44(extraout_var_00,iVar9) <= (ulong)uVar13) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)this,uVar13,(Index)sVar3);
    IVar10 = Globals::CastLIndexToIndex(i);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,
                         (ulong)uVar13);
    *pvVar11 = IVar10;
    uVar13 = uVar13 + 1;
  }
  this_01 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
  q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
  local_1b8.px = local_338;
  local_1b8.pn.pi_ = sStack_330.pi_;
  if (sStack_330.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (sStack_330.pi_)->use_count_ = (sStack_330.pi_)->use_count_ + 1;
    UNLOCK();
  }
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,&local_1b8);
  boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
            (&local_388,this_01);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_bgCounter;
  *psVar2 = *psVar2 + 1;
  __lhs = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_GeneralizedMAAStarPlanner._m_bgBaseFilename;
  bVar8 = std::operator!=(__lhs,"");
  if (bVar8) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    poVar12 = std::operator<<(local_1a8,(string *)__lhs);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    peVar7 = local_388.px;
    std::__cxx11::stringbuf::str();
    BayesianGameIdenticalPayoff::Save
              (&peVar7->super_BayesianGameIdenticalPayoff,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  }
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_2f0 = (priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
               *)(local_338->super_PartialJointPolicy)._m_pastReward;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8.px = (element_type *)&(local_388.px)->super_BayesianGameIdenticalPayoff;
  local_310 = local_388.px;
  if (local_388.px == (element_type *)0x0) {
    local_2b8.px = (element_type *)0x0;
  }
  local_2b8.pn.pi_ = local_388.pn.pi_;
  if (local_388.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_388.pn.pi_)->use_count_ = (local_388.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  JointPolicyPureVector::JointPolicyPureVector(&local_250,&local_2b8,TYPE_INDEX);
  boost::detail::shared_count::~shared_count(&local_2b8.pn);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  poVar12 = std::operator<<(local_1a8,"GMAA::kGMAA_ts");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__cxx11::stringbuf::str();
  this_00 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_GeneralizedMAAStarPlanner;
  TimedAlgorithm::StartTimer(&this_00->super_TimedAlgorithm,(string *)local_358);
  std::__cxx11::string::~string((string *)local_358);
  pBVar4 = this->_m_newBGIP_Solver;
  local_358._0_8_ = &(local_388.px)->super_BayesianGameIdenticalPayoff;
  if (local_388.px == (element_type *)0x0) {
    local_358._0_8_ = (BayesianGameIdenticalPayoff *)0x0;
  }
  local_358._8_8_ = local_388.pn.pi_;
  if (local_388.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_388.pn.pi_)->use_count_ = (local_388.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  p = (BayesianGameIdenticalPayoffSolver *)(**(code **)(*(long *)pBVar4 + 0x10))(pBVar4,local_358);
  auVar16._8_56_ = extraout_var_01;
  auVar16._0_8_ = extraout_XMM1_Qa;
  auVar15 = auVar16._0_16_;
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
  shared_ptr<BayesianGameIdenticalPayoffSolver>(&local_368,p);
  local_2f8 = &this_00->super_TimedAlgorithm;
  boost::detail::shared_count::~shared_count((shared_count *)(local_358 + 8));
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
            (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&local_368);
  (*(local_368.px)->_vptr_BayesianGameIdenticalPayoffSolver[4])();
  uVar13 = 0;
  (*((local_388.px)->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[3])(local_388.px,0);
  local_310 = (element_type *)
              &(local_310->super_BayesianGameIdenticalPayoff).
               super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  auVar15 = vcvtusi2sd_avx512f(auVar15,sVar3);
  local_2e8 = auVar15._0_8_;
  do {
    if ((this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_GeneralizedMAAStarPlanner.
        _m_nrPoliciesToProcess <= (ulong)uVar13) {
LAB_00441872:
      (*((local_388.px)->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[4])();
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(local_2f8,(string *)local_358);
      bVar8 = sVar3 == local_378;
      std::__cxx11::string::~string((string *)local_358);
      boost::detail::shared_count::~shared_count(&local_368.pn);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      JointPolicyPureVector::~JointPolicyPureVector(&local_250);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_280);
      boost::detail::shared_count::~shared_count(&local_388.pn);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2a8);
      boost::detail::shared_count::~shared_count(&sStack_330);
      return bVar8;
    }
    bVar8 = BGIPSolution::IsEmptyJPPV(&(local_368.px)->_m_solution);
    if (bVar8) {
      poVar12 = std::operator<<((ostream *)&std::cerr,"Warning, BGIP_Solver only returned ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," usable joint policies");
      std::endl<char,std::char_traits<char>>(poVar12);
      goto LAB_00441872;
    }
    BGIPSolution::GetNextSolutionJPPV((BGIPSolution *)local_358);
    local_328 = (_List_node_base *)
                (((vector<double,_std::allocator<double>_> *)(local_358._0_8_ + 0x10))->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start;
    asStack_320[0].pi_ = *(sp_counted_base **)(local_358._0_8_ + 0x18);
    if (*(pointer *)(local_358._0_8_ + 0x18) != (pointer)0x0) {
      LOCK();
      pdVar1 = *(pointer *)(local_358._0_8_ + 0x18) + 1;
      *(int *)pdVar1 = *(int *)pdVar1 + 1;
      UNLOCK();
    }
    BGIPSolution::PopNextSolutionJPPV(&(local_368.px)->_m_solution);
    (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_PlanningUnitDecPOMDPDiscrete.
      super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[0x18])
              (&local_2c8,this,local_338,local_328,local_310,&local_2a8);
    local_370 = (double)(**(code **)(*(long *)local_358._0_8_ + 0x18))();
    pDVar5 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
    __x = (double)(**(code **)(*(long *)((long)&pDVar5->field_0x0 +
                                        *(long *)(*(long *)pDVar5 + -0xb0)) + 0x70))
                            ((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
    p_Var14 = (_Base_ptr)pow(__x,(double)local_2e8);
    local_308 = local_328;
    sStack_300.pi_ = asStack_320[0].pi_;
    if (asStack_320[0].pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (asStack_320[0].pi_)->use_count_ = (asStack_320[0].pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_2d0 = p_Var14;
    (*((local_388.px)->super_BayesianGameForDecPOMDPStageInterface).
      _vptr_BayesianGameForDecPOMDPStageInterface[5])(local_388.px,&local_308,0);
    bVar8 = sVar3 == local_378;
    local_370 = (double)local_2d0 * local_370;
    local_2d8 = p_Var14;
    boost::detail::shared_count::~shared_count(&sStack_300);
    local_2c8[1]._M_right = (_Base_ptr)((double)local_2f0 + (double)local_2d8);
    peVar6 = local_2e0->px;
    (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_PlanningUnitDecPOMDPDiscrete.
      super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[0x16])
              ((ulong)bVar8 * (long)((double)local_2f0 + (double)local_2d8) +
               (ulong)!bVar8 * (long)((double)local_2f0 + local_370),local_290,this,&local_2c8);
    (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_290);
    boost::detail::shared_count::~shared_count(&local_288);
    boost::detail::shared_count::~shared_count(&local_2c0);
    boost::detail::shared_count::~shared_count(asStack_320);
    boost::detail::shared_count::~shared_count((shared_count *)(local_358 + 8));
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool GMAA_kGMAA::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi, 
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    // Construct the bayesian game for this timestep - 
    boost::shared_ptr<BayesianGameForDecPOMDPStage> bg_ts=
        boost::shared_ptr<BayesianGameForDecPOMDPStage>(
        new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            ));

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

    double prevPastReward = jpolPrevTs->GetPastReward();
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    //size_t nrJOHts = bg_ts->GetNrJointTypes(); 

    //The set of Indicies of the policies added to poolOfNextPolicies
    //(to avoid adding duplicates).
    set<Index> poolOfNextPoliciesIndices;

    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts,
            PolicyGlobals::TYPE_INDEX);

    stringstream ss;
    ss << "GMAA::kGMAA_ts" << ts;
    StartTimer(ss.str());
    
    //solve the Bayesian game
    //boost::shared_ptr<
    //BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips=
        //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> >((*_m_newBGIP_Solver)(bg_ts));
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips =
        boost::shared_ptr<BayesianGameIdenticalPayoffSolver>(
                _m_newBGIP_Solver->operator()(bg_ts)
                );

    SetCBGbounds(ppi,bgips);
    bgips->Solve();

    //for each solution in BGIPSolution  
    bg_ts->ComputeAllImmediateRewards();
    for(Index solI=0; solI < _m_nrPoliciesToProcess; solI++)
    {
        if(bgips->IsEmptyJPPV())
        {
            cerr << "Warning, BGIP_Solver only returned "<<solI<<
                " usable joint policies"<<endl;
            break;
        }
        const boost::shared_ptr<JPPVValuePair> jpvp = bgips->GetNextSolutionJPPV();
        JPPV_sharedPtr bgpol = jpvp->GetJPPV();

        bgips->PopNextSolutionJPPV();
        PJPDP_sharedPtr jpolTs = 
            ConstructExtendedJointPolicy(*jpolPrevTs,
                                    *bgpol, nrOHts, firstOHtsI);

        double val = jpvp->GetValue();
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double newPastreward = prevPastReward + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

        /*//push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ///[>EXACT* past reward, newPastreward.
        if(is_last_ts)
            poolOfNextPolicies->Insert( NewPPI(jpolTs,newPastreward) );
        else // VAL SHOULD BE DISCOUNTED?
            poolOfNextPolicies->Insert( NewPPI(jpolTs,
                                        val + prevPastReward) );*/

    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}